

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  u16 uVar1;
  short sVar2;
  int iVar3;
  Table *pTab;
  sqlite3 *db;
  Schema *pSVar4;
  Column *pCVar5;
  Index *pIdx;
  LogEst LVar6;
  uint uVar7;
  int p2;
  void *pvVar8;
  Vdbe *pVVar9;
  Parse *pPVar10;
  Table *pTable;
  Token *pTVar11;
  size_t sVar12;
  Expr *pExpr;
  ExprList *pList;
  ushort uVar13;
  int iVar14;
  Schema **ppSVar15;
  Op *pOVar16;
  short sVar17;
  u8 *puVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  short *psVar25;
  short *psVar26;
  ulong uVar27;
  Index *pIVar28;
  int iVar29;
  int iVar30;
  Op *pOVar31;
  bool bVar32;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if ((db->init).busy != '\0') {
    if (pSelect != (Select *)0x0) {
      pcVar21 = "";
      goto LAB_00165b4b;
    }
    iVar29 = (db->init).newTnum;
    pTab->tnum = iVar29;
    if (iVar29 == 1) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  if ((tabOpts & 0x20) == 0) goto LAB_0016573c;
  uVar7 = pTab->tabFlags;
  if ((uVar7 & 8) != 0) {
    pcVar21 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_00165b4b:
    sqlite3ErrorMsg(pParse,pcVar21);
    return;
  }
  if ((uVar7 & 4) == 0) {
    sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    goto LAB_0016573c;
  }
  pTab->tabFlags = uVar7 | 0x60;
  pVVar9 = pParse->pVdbe;
  if ((((db->init).field_0x6 & 2) == 0) && (sVar17 = pTab->nCol, 0 < (long)sVar17)) {
    pCVar5 = pTab->aCol;
    lVar19 = 0;
    do {
      if (((&pCVar5->colFlags)[lVar19] & 1) != 0) {
        (&pCVar5->notNull)[lVar19] = '\x02';
      }
      lVar19 = lVar19 + 0x20;
    } while ((long)sVar17 * 0x20 != lVar19);
  }
  iVar29 = pParse->addrCrTab;
  if (iVar29 != 0) {
    if (iVar29 < 0) {
      iVar29 = pVVar9->nOp + -1;
    }
    if (pVVar9->db->mallocFailed == '\0') {
      pOVar16 = pVVar9->aOp + iVar29;
    }
    else {
      pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar16->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    for (pIVar28 = pTab->pIndex; pIVar28 != (Index *)0x0; pIVar28 = pIVar28->pNext) {
      if ((*(ushort *)&pIVar28->field_0x63 & 3) == 2) goto LAB_00165dbc;
    }
    pIVar28 = (Index *)0x0;
LAB_00165dbc:
    uVar13 = pIVar28->nKeyCol;
    iVar29 = 1;
    if (1 < uVar13) {
      psVar25 = pIVar28->aiColumn;
      iVar29 = 1;
      uVar20 = 1;
      do {
        psVar26 = psVar25;
        iVar14 = iVar29;
        do {
          if (iVar14 < 1) {
            lVar19 = (long)iVar29;
            iVar29 = iVar29 + 1;
            psVar25[lVar19] = psVar25[uVar20];
            uVar13 = pIVar28->nKeyCol;
            goto LAB_00165e0d;
          }
          iVar14 = iVar14 + -1;
          sVar17 = *psVar26;
          psVar26 = psVar26 + 1;
        } while (sVar17 != psVar25[uVar20]);
        pIVar28->nColumn = pIVar28->nColumn - 1;
LAB_00165e0d:
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar13);
    }
    pIVar28->nKeyCol = (u16)iVar29;
  }
  else {
    dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
    if ((char *)dest._0_8_ == (char *)0x0) {
      uVar7 = 0;
    }
    else {
      sVar12 = strlen((char *)dest._0_8_);
      uVar7 = (uint)sVar12 & 0x3fffffff;
    }
    dest.iSdst = uVar7;
    pExpr = sqlite3ExprAlloc(db,0x3b,(Token *)&dest,0);
    pList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
    if (pList == (ExprList *)0x0) goto LAB_0016573c;
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                       (Token *)0x0,(Expr *)0x0,0,0,'\x02');
    if ((db->mallocFailed != '\0') || (pParse->nErr != 0)) goto LAB_0016573c;
    pIVar28 = pTab->pIndex;
    if (pIVar28 == (Index *)0x0) {
      pIVar28 = (Index *)0x0;
    }
    else {
      do {
        if ((*(ushort *)&pIVar28->field_0x63 & 3) == 2) goto LAB_00166118;
        pIVar28 = pIVar28->pNext;
      } while (pIVar28 != (Index *)0x0);
      pIVar28 = (Index *)0x0;
    }
LAB_00166118:
    pTab->iPKey = -1;
  }
  uVar13 = *(ushort *)&pIVar28->field_0x63;
  *(ushort *)&pIVar28->field_0x63 = uVar13 | 0x20;
  if (((db->init).field_0x6 & 2) == 0) {
    *(ushort *)&pIVar28->field_0x63 = uVar13 | 0x28;
  }
  uVar13 = pIVar28->nKeyCol;
  uVar20 = (ulong)uVar13;
  if ((pVVar9 != (Vdbe *)0x0) && (0 < (long)pIVar28->tnum)) {
    if (pVVar9->db->mallocFailed == '\0') {
      pOVar16 = pVVar9->aOp + pIVar28->tnum;
    }
    else {
      pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar16->opcode = '\v';
  }
  pIVar28->tnum = pTab->tnum;
  for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
    if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
      if (uVar20 != 0) {
        uVar24 = 0;
        iVar29 = 0;
        do {
          uVar7 = (uint)pIdx->nKeyCol;
          psVar25 = pIdx->aiColumn;
          do {
            if ((int)uVar7 < 1) {
              iVar29 = iVar29 + 1;
              break;
            }
            uVar7 = uVar7 - 1;
            sVar17 = *psVar25;
            psVar25 = psVar25 + 1;
          } while (sVar17 != pIVar28->aiColumn[uVar24]);
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar20);
        if (iVar29 != 0) {
          iVar29 = resizeIndexObject(db,pIdx,iVar29 + (uint)pIdx->nKeyCol);
          if (iVar29 == 0) {
            if (uVar20 != 0) {
              uVar7 = (uint)pIdx->nKeyCol;
              uVar24 = 0;
              do {
                uVar22 = (uint)pIdx->nKeyCol;
                psVar25 = pIdx->aiColumn;
                do {
                  if ((int)uVar22 < 1) {
                    pIdx->aiColumn[(int)uVar7] = pIVar28->aiColumn[uVar24];
                    pIdx->azColl[(int)uVar7] = pIVar28->azColl[uVar24];
                    uVar7 = uVar7 + 1;
                    break;
                  }
                  uVar22 = uVar22 - 1;
                  sVar17 = *psVar25;
                  psVar25 = psVar25 + 1;
                } while (sVar17 != pIVar28->aiColumn[uVar24]);
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar20);
            }
            goto LAB_0016603d;
          }
          goto LAB_0016573c;
        }
      }
      pIdx->nColumn = pIdx->nKeyCol;
    }
LAB_0016603d:
  }
  uVar1 = pTab->nCol;
  if ((int)(uint)uVar13 < (int)(short)uVar1) {
    iVar29 = resizeIndexObject(db,pIVar28,(int)(short)uVar1);
    if (iVar29 != 0) goto LAB_0016573c;
    sVar17 = pTab->nCol;
    if (0 < sVar17) {
      iVar29 = 0;
      do {
        iVar14 = (int)uVar20;
        psVar25 = pIVar28->aiColumn;
        uVar24 = uVar20;
        do {
          if ((int)uVar24 < 1) {
            pIVar28->aiColumn[iVar14] = (short)iVar29;
            pIVar28->azColl[iVar14] = "BINARY";
            uVar20 = (ulong)(iVar14 + 1);
            sVar17 = pTab->nCol;
            break;
          }
          uVar24 = (ulong)((int)uVar24 - 1);
          sVar2 = *psVar25;
          psVar25 = psVar25 + 1;
        } while (iVar29 != sVar2);
        iVar29 = iVar29 + 1;
      } while (iVar29 < sVar17);
    }
  }
  else {
    pIVar28->nColumn = uVar1;
  }
  if ((ulong)pIVar28->nColumn == 0) {
    uVar20 = 0xffffffffffffffff;
  }
  else {
    uVar24 = (ulong)pIVar28->nColumn + 1;
    uVar20 = 0;
    do {
      uVar27 = 1L << ((byte)pIVar28->aiColumn[uVar24 - 2] & 0x3f);
      if (0x3e < (ushort)pIVar28->aiColumn[uVar24 - 2]) {
        uVar27 = 0;
      }
      uVar20 = uVar20 | uVar27;
      uVar24 = uVar24 - 1;
    } while (1 < uVar24);
    uVar20 = ~uVar20;
  }
  pIVar28->colNotIdxed = uVar20;
LAB_0016573c:
  if (pTab->pSchema == (Schema *)0x0) {
    iVar29 = -1000000;
  }
  else {
    iVar29 = -1;
    ppSVar15 = &db->aDb->pSchema;
    do {
      iVar29 = iVar29 + 1;
      pSVar4 = *ppSVar15;
      ppSVar15 = ppSVar15 + 4;
    } while (pSVar4 != pTab->pSchema);
  }
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar14 = 0;
  }
  else {
    uVar7 = (int)pTab->nCol + 1;
    puVar18 = &pTab->aCol->szEst;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + (uint)*puVar18;
      uVar7 = uVar7 - 1;
      puVar18 = puVar18 + 0x20;
    } while (1 < uVar7);
  }
  LVar6 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar14) * 4));
  pTab->szTabRow = LVar6;
  for (pIVar28 = pTab->pIndex; pIVar28 != (Index *)0x0; pIVar28 = pIVar28->pNext) {
    estimateIndexWidth(pIVar28);
  }
  if ((db->init).busy == '\0') {
    pVVar9 = sqlite3GetVdbe(pParse);
    if (pVVar9 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar9,0x75,0,0,0);
    bVar32 = pTab->pSelect == (Select *)0x0;
    pcVar21 = "VIEW";
    if (bVar32) {
      pcVar21 = "TABLE";
    }
    pcVar23 = "view";
    if (bVar32) {
      pcVar23 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar11 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar11 = pEnd;
      }
      uVar7 = (int)pTVar11->z - (int)(pParse->sNameToken).z;
      if (*pTVar11->z != ';') {
        uVar7 = uVar7 + pTVar11->n;
      }
      pcVar21 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar21,(ulong)uVar7);
    }
    else {
      iVar14 = pParse->nMem;
      iVar30 = iVar14 + 1;
      p2 = iVar14 + 3;
      pParse->nMem = p2;
      pPVar10 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar10 = pParse;
      }
      pPVar10->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar9,0x6e,1,pParse->regRoot,iVar29);
      iVar3 = pVVar9->nOp;
      if (0 < (long)iVar3) {
        pVVar9->aOp[(long)iVar3 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar9,0xd,iVar30,0,iVar3 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      dest.eDest = '\r';
      dest.iSDParm = iVar30;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeAddOp3(pVVar9,0x43,iVar30,0,0);
      pPVar10 = pVVar9->pParse;
      pPVar10->nTempReg = '\0';
      pPVar10->nRangeReg = 0;
      pOVar31 = (Op *)&sqlite3VdbeGetOp_dummy;
      pOVar16 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar9->db->mallocFailed == '\0') {
        iVar30 = pVVar9->nOp + -1;
        if (-1 < iVar3) {
          iVar30 = iVar3;
        }
        pOVar16 = pVVar9->aOp + iVar30;
      }
      pOVar16->p2 = pVVar9->nOp;
      iVar30 = sqlite3VdbeAddOp3(pVVar9,0xe,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar9,0x66,dest.iSdst,dest.nSdst,iVar14 + 2);
      sqlite3TableAffinity(pVVar9,pTab,0);
      sqlite3VdbeAddOp3(pVVar9,0x79,1,p2,0);
      sqlite3VdbeAddOp3(pVVar9,0x7a,1,iVar14 + 2,p2);
      sqlite3VdbeAddOp3(pVVar9,0xb,0,iVar30,0);
      if (pVVar9->db->mallocFailed == '\0') {
        iVar14 = pVVar9->nOp + -1;
        if (-1 < iVar30) {
          iVar14 = iVar30;
        }
        pOVar31 = pVVar9->aOp + iVar14;
      }
      pOVar31->p2 = pVVar9->nOp;
      sqlite3VdbeAddOp3(pVVar9,0x75,1,0,0);
      pcVar21 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar29].zDbSName,"sqlite_master",pcVar23,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar21,(ulong)(uint)pParse->regRowid);
    if (pcVar21 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar21);
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x6b,iVar29,1,
                      (pParse->db->aDb[iVar29].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar29].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar29].zDbSName
                        );
    }
    pcVar21 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar9,iVar29,pcVar21);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar8 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar8 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar21 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar29 = sqlite3Utf8CharLen(pcVar21,*(int *)&pEnd->z - (int)pcVar21);
      pTab->addColOffset = iVar29 + 0xd;
    }
  }
  else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}